

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLookupResultValid
               (TextureCubeView *texture,Sampler *sampler,LookupPrecision *prec,Vec3 *coord,
               Vec2 *lodBounds,Vec4 *result)

{
  int *piVar1;
  float fVar2;
  Vec3 *prec_00;
  LookupPrecision *pLVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int b;
  FilterMode FVar7;
  float a;
  float a_00;
  float fVar8;
  ConstPixelBufferAccess *local_618;
  ConstPixelBufferAccess *local_5f8;
  ConstPixelBufferAccess *local_5c8;
  ConstPixelBufferAccess *local_5b0;
  ConstPixelBufferAccess *local_598;
  undefined1 local_588 [8];
  ConstPixelBufferAccess faces_2 [6];
  ConstPixelBufferAccess faces_1 [6];
  int local_39c;
  int levelNdx_1;
  int maxLevel_1;
  int minLevel_1;
  undefined1 local_388 [8];
  ConstPixelBufferAccess faces1 [6];
  ConstPixelBufferAccess faces0 [6];
  float maxF;
  float minF;
  int levelNdx;
  int maxLevel;
  int minLevel;
  int maxTexLevel;
  int minTexLevel;
  bool isLinearMipmap;
  bool isNearestMipmap;
  ConstPixelBufferAccess faces [6];
  bool canBeMinified;
  bool canBeMagnified;
  float maxLod;
  float minLod;
  undefined1 local_78 [8];
  CubeFaceFloatCoords faceCoords;
  int tryFaceNdx;
  CubeFace possibleFaces [6];
  int local_44;
  Vec4 *pVStack_40;
  int numPossibleFaces;
  Vec4 *result_local;
  Vec2 *lodBounds_local;
  Vec3 *coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  TextureCubeView *texture_local;
  
  local_44 = 0;
  pVStack_40 = result;
  result_local = (Vec4 *)lodBounds;
  lodBounds_local = (Vec2 *)coord;
  coord_local = (Vec3 *)prec;
  prec_local = (LookupPrecision *)sampler;
  sampler_local = (Sampler *)texture;
  TexVerifierUtil::getPossibleCubeFaces(coord,&prec->coordBits,(CubeFace *)&faceCoords.t,&local_44);
  if (local_44 == 0) {
    texture_local._7_1_ = true;
  }
  else {
    for (faceCoords.s = 0.0; (int)faceCoords.s < local_44;
        faceCoords.s = (float)((int)faceCoords.s + 1)) {
      fVar8 = (&faceCoords.t)[(int)faceCoords.s];
      projectToFace((tcu *)&maxLod,(CubeFace)(&faceCoords.t)[(int)faceCoords.s],
                    (Vec3 *)lodBounds_local);
      CubeFaceCoords<float>::CubeFaceCoords
                ((CubeFaceCoords<float> *)local_78,(CubeFace)fVar8,(Vector<float,_2> *)&maxLod);
      a = Vector<float,_2>::x((Vector<float,_2> *)result_local);
      a_00 = Vector<float,_2>::y((Vector<float,_2> *)result_local);
      piVar1 = (prec_local->uvwBits).m_data + 2;
      fVar8 = (float)*piVar1;
      fVar2 = (float)*piVar1;
      if (a <= (float)(prec_local->uvwBits).m_data[2]) {
        local_598 = (ConstPixelBufferAccess *)&minTexLevel;
        do {
          ConstPixelBufferAccess::ConstPixelBufferAccess(local_598);
          local_598 = local_598 + 1;
        } while (local_598 != (ConstPixelBufferAccess *)&faces[5].m_data);
        getCubeLevelFaces((TextureCubeView *)sampler_local,0,
                          (ConstPixelBufferAccess (*) [6])&minTexLevel);
        bVar4 = isCubeLevelSampleResultValid
                          ((ConstPixelBufferAccess (*) [6])&minTexLevel,(Sampler *)prec_local,
                           (prec_local->uvwBits).m_data[1],(LookupPrecision *)coord_local,
                           (CubeFaceFloatCoords *)local_78,pVStack_40);
        if (bVar4) {
          return true;
        }
      }
      if (fVar2 <= a_00 && a_00 != fVar8) {
        bVar4 = TexVerifierUtil::isNearestMipmapFilter((prec_local->uvwBits).m_data[0]);
        bVar5 = TexVerifierUtil::isLinearMipmapFilter((prec_local->uvwBits).m_data[0]);
        iVar6 = TextureCubeView::getNumLevels((TextureCubeView *)sampler_local);
        b = iVar6 + -1;
        if ((bVar5) && (0 < b)) {
          fVar8 = ::deFloatFloor(a);
          maxF = (float)de::clamp<int>((int)fVar8,0,iVar6 + -2);
          fVar8 = ::deFloatFloor(a_00);
          iVar6 = de::clamp<int>((int)fVar8,0,iVar6 + -2);
          for (; (int)maxF <= iVar6; maxF = (float)((int)maxF + 1)) {
            faces0[5].m_data._4_4_ = de::clamp<float>(a - (float)(int)maxF,0.0,1.0);
            faces0[5].m_data._0_4_ = de::clamp<float>(a_00 - (float)(int)maxF,0.0,1.0);
            local_5b0 = (ConstPixelBufferAccess *)&faces1[5].m_data;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess(local_5b0);
              local_5b0 = local_5b0 + 1;
            } while (local_5b0 != (ConstPixelBufferAccess *)&faces0[5].m_data);
            local_5c8 = (ConstPixelBufferAccess *)local_388;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess(local_5c8);
              local_5c8 = local_5c8 + 1;
            } while (local_5c8 != (ConstPixelBufferAccess *)&faces1[5].m_data);
            getCubeLevelFaces((TextureCubeView *)sampler_local,(int)maxF,
                              (ConstPixelBufferAccess (*) [6])&faces1[5].m_data);
            getCubeLevelFaces((TextureCubeView *)sampler_local,(int)maxF + 1,
                              (ConstPixelBufferAccess (*) [6])local_388);
            pLVar3 = prec_local;
            FVar7 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
            prec_00 = coord_local;
            Vector<float,_2>::Vector
                      ((Vector<float,_2> *)&maxLevel_1,faces0[5].m_data._4_4_,faces0[5].m_data._0_4_
                      );
            bVar4 = isCubeMipmapLinearSampleResultValid
                              ((ConstPixelBufferAccess (*) [6])&faces1[5].m_data,
                               (ConstPixelBufferAccess (*) [6])local_388,(Sampler *)pLVar3,FVar7,
                               (LookupPrecision *)prec_00,(CubeFaceFloatCoords *)local_78,
                               (Vec2 *)&maxLevel_1,pVStack_40);
            if (bVar4) {
              return true;
            }
          }
        }
        else if (bVar4) {
          fVar8 = ::deFloatCeil(a + 0.5);
          local_39c = de::clamp<int>((int)fVar8 + -1,0,b);
          fVar8 = ::deFloatFloor(a_00 + 0.5);
          iVar6 = de::clamp<int>((int)fVar8,0,b);
          for (; local_39c <= iVar6; local_39c = local_39c + 1) {
            local_5f8 = (ConstPixelBufferAccess *)&faces_2[5].m_data;
            do {
              ConstPixelBufferAccess::ConstPixelBufferAccess(local_5f8);
              local_5f8 = local_5f8 + 1;
            } while (local_5f8 != (ConstPixelBufferAccess *)&faces_1[5].m_data);
            getCubeLevelFaces((TextureCubeView *)sampler_local,local_39c,
                              (ConstPixelBufferAccess (*) [6])&faces_2[5].m_data);
            pLVar3 = prec_local;
            FVar7 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
            bVar4 = isCubeLevelSampleResultValid
                              ((ConstPixelBufferAccess (*) [6])&faces_2[5].m_data,(Sampler *)pLVar3,
                               FVar7,(LookupPrecision *)coord_local,(CubeFaceFloatCoords *)local_78,
                               pVStack_40);
            if (bVar4) {
              return true;
            }
          }
        }
        else {
          local_618 = (ConstPixelBufferAccess *)local_588;
          do {
            ConstPixelBufferAccess::ConstPixelBufferAccess(local_618);
            local_618 = local_618 + 1;
          } while (local_618 != (ConstPixelBufferAccess *)&faces_2[5].m_data);
          getCubeLevelFaces((TextureCubeView *)sampler_local,0,
                            (ConstPixelBufferAccess (*) [6])local_588);
          bVar4 = isCubeLevelSampleResultValid
                            ((ConstPixelBufferAccess (*) [6])local_588,(Sampler *)prec_local,
                             (prec_local->uvwBits).m_data[0],(LookupPrecision *)coord_local,
                             (CubeFaceFloatCoords *)local_78,pVStack_40);
          if (bVar4) {
            return true;
          }
        }
      }
    }
    texture_local._7_1_ = false;
  }
  return texture_local._7_1_;
}

Assistant:

bool isLookupResultValid (const TextureCubeView& texture, const Sampler& sampler, const LookupPrecision& prec, const Vec3& coord, const Vec2& lodBounds, const Vec4& result)
{
	int			numPossibleFaces				= 0;
	CubeFace	possibleFaces[CUBEFACE_LAST];

	DE_ASSERT(isSamplerSupported(sampler));

	getPossibleCubeFaces(coord, prec.coordBits, &possibleFaces[0], numPossibleFaces);

	if (numPossibleFaces == 0)
		return true; // Result is undefined.

	for (int tryFaceNdx = 0; tryFaceNdx < numPossibleFaces; tryFaceNdx++)
	{
		const CubeFaceFloatCoords	faceCoords		(possibleFaces[tryFaceNdx], projectToFace(possibleFaces[tryFaceNdx], coord));
		const float					minLod			= lodBounds.x();
		const float					maxLod			= lodBounds.y();
		const bool					canBeMagnified	= minLod <= sampler.lodThreshold;
		const bool					canBeMinified	= maxLod > sampler.lodThreshold;

		if (canBeMagnified)
		{
			ConstPixelBufferAccess faces[CUBEFACE_LAST];
			getCubeLevelFaces(texture, 0, faces);

			if (isCubeLevelSampleResultValid(faces, sampler, sampler.magFilter, prec, faceCoords, result))
				return true;
		}

		if (canBeMinified)
		{
			const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
			const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
			const int	minTexLevel		= 0;
			const int	maxTexLevel		= texture.getNumLevels()-1;

			DE_ASSERT(minTexLevel <= maxTexLevel);

			if (isLinearMipmap && minTexLevel < maxTexLevel)
			{
				const int	minLevel	= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					const float				minF	= de::clamp(minLod - float(levelNdx), 0.0f, 1.0f);
					const float				maxF	= de::clamp(maxLod - float(levelNdx), 0.0f, 1.0f);

					ConstPixelBufferAccess	faces0[CUBEFACE_LAST];
					ConstPixelBufferAccess	faces1[CUBEFACE_LAST];

					getCubeLevelFaces(texture, levelNdx,		faces0);
					getCubeLevelFaces(texture, levelNdx + 1,	faces1);

					if (isCubeMipmapLinearSampleResultValid(faces0, faces1, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, Vec2(minF, maxF), result))
						return true;
				}
			}
			else if (isNearestMipmap)
			{
				// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
				//		 decision to allow floor(lod + 0.5) as well.
				const int	minLevel	= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
				const int	maxLevel	= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

				DE_ASSERT(minLevel <= maxLevel);

				for (int levelNdx = minLevel; levelNdx <= maxLevel; levelNdx++)
				{
					ConstPixelBufferAccess faces[CUBEFACE_LAST];
					getCubeLevelFaces(texture, levelNdx, faces);

					if (isCubeLevelSampleResultValid(faces, sampler, getLevelFilter(sampler.minFilter), prec, faceCoords, result))
						return true;
				}
			}
			else
			{
				ConstPixelBufferAccess faces[CUBEFACE_LAST];
				getCubeLevelFaces(texture, 0, faces);

				if (isCubeLevelSampleResultValid(faces, sampler, sampler.minFilter, prec, faceCoords, result))
					return true;
			}
		}
	}

	return false;
}